

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_perftest.cc
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  char *__s;
  bool bVar2;
  int iVar3;
  int64_t iVar4;
  int64_t iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int local_f0;
  allocator<char> local_e9;
  vector<float,_std::allocator<float>_> times;
  string err;
  string buf;
  DepfileParser parser;
  
  if (argc < 2) {
    printf("usage: %s <file1> <file2...>\n",*argv);
    local_f0 = 1;
  }
  else {
    times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_f0 = 0;
    for (uVar6 = 1; uVar6 != (uint)argc; uVar6 = uVar6 + 1) {
      __s = argv[uVar6];
      for (uVar8 = 0x400; uVar8 < 0x100000; uVar8 = uVar8 * 2) {
        iVar4 = GetTimeMillis();
        uVar9 = 0xffffffff;
        while (uVar9 = uVar9 + 1, uVar8 != uVar9) {
          buf._M_dataplus._M_p = (pointer)&buf.field_2;
          buf._M_string_length = 0;
          buf.field_2._M_local_buf[0] = '\0';
          err._M_dataplus._M_p = (pointer)&err.field_2;
          err._M_string_length = 0;
          err.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string<std::allocator<char>>((string *)&parser,__s,&local_e9);
          iVar3 = ReadFile((string *)&parser,&buf,&err);
          std::__cxx11::string::~string((string *)&parser);
          if (iVar3 < 0) {
            bVar2 = false;
            printf("%s: %s\n",__s,err._M_dataplus._M_p);
            local_f0 = 1;
          }
          else {
            DepfileParser::DepfileParser(&parser);
            bVar2 = DepfileParser::Parse(&parser,&buf,&err);
            if (!bVar2) {
              printf("%s: %s\n",__s,err._M_dataplus._M_p);
              local_f0 = 1;
            }
            DepfileParser::~DepfileParser(&parser);
          }
          std::__cxx11::string::~string((string *)&err);
          std::__cxx11::string::~string((string *)&buf);
          if (bVar2 == false) goto LAB_00105ddd;
        }
        iVar5 = GetTimeMillis();
        if (100 < iVar5 - iVar4) {
          parser.outs_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               (float)((int)(iVar5 - iVar4) * 1000) / (float)(int)uVar8;
          printf("%s: %.1fus\n",
                 SUB84((double)parser.outs_.
                               super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl
                               .super__Vector_impl_data._M_start._0_4_,0),__s);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&times,(value_type_conflict *)&parser);
          break;
        }
      }
    }
    if (times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      fVar12 = *times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = (long)times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      fVar13 = 0.0;
      fVar10 = fVar12;
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        fVar1 = times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        fVar11 = fVar1;
        if ((fVar10 <= fVar1) && (fVar11 = fVar10, fVar12 < fVar1)) {
          fVar12 = fVar1;
        }
        fVar13 = fVar13 + fVar1;
        fVar10 = fVar11;
      }
      printf("min %.1fus  max %.1fus  avg %.1fus\n",SUB84((double)fVar10,0),(double)fVar12,
             (double)(fVar13 / (float)uVar6));
    }
    local_f0 = 0;
LAB_00105ddd:
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&times.super__Vector_base<float,_std::allocator<float>_>);
  }
  return local_f0;
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc < 2) {
    printf("usage: %s <file1> <file2...>\n", argv[0]);
    return 1;
  }

  vector<float> times;
  for (int i = 1; i < argc; ++i) {
    const char* filename = argv[i];

    for (int limit = 1 << 10; limit < (1<<20); limit *= 2) {
      int64_t start = GetTimeMillis();
      for (int rep = 0; rep < limit; ++rep) {
        string buf;
        string err;
        if (ReadFile(filename, &buf, &err) < 0) {
          printf("%s: %s\n", filename, err.c_str());
          return 1;
        }

        DepfileParser parser;
        if (!parser.Parse(&buf, &err)) {
          printf("%s: %s\n", filename, err.c_str());
          return 1;
        }
      }
      int64_t end = GetTimeMillis();

      if (end - start > 100) {
        int delta = (int)(end - start);
        float time = delta*1000 / (float)limit;
        printf("%s: %.1fus\n", filename, time);
        times.push_back(time);
        break;
      }
    }
  }

  if (!times.empty()) {
    float min = times[0];
    float max = times[0];
    float total = 0;
    for (size_t i = 0; i < times.size(); ++i) {
      total += times[i];
      if (times[i] < min)
        min = times[i];
      else if (times[i] > max)
        max = times[i];
    }

    printf("min %.1fus  max %.1fus  avg %.1fus\n",
           min, max, total / times.size());
  }

  return 0;
}